

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

void __thiscall
pbrt::PiecewiseLinearSpectrum::PiecewiseLinearSpectrum
          (PiecewiseLinearSpectrum *this,span<const_float> l,span<const_float> v,Allocator alloc)

{
  float fVar1;
  iterator pfVar2;
  iterator args_5;
  iterator fmt;
  char (*pacVar3) [15];
  char (*pacVar4) [15];
  size_t sVar5;
  reference pvVar6;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  value_type_conflict1 vb_1;
  value_type_conflict1 va_1;
  size_t i;
  size_t vb;
  size_t va;
  polymorphic_allocator<float> *in_stack_fffffffffffffef8;
  polymorphic_allocator<float> *in_stack_ffffffffffffff00;
  float *in_stack_ffffffffffffff08;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff10;
  char (*args_1) [15];
  char (*args) [15];
  span<const_float> *this_00;
  char (*args_2) [15];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *args_3;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *args_4;
  ulong local_68;
  char local_50 [24];
  char local_38 [24];
  span<const_float> local_20;
  span<const_float> local_10;
  
  this_00 = &local_10;
  args_3 = in_RDI;
  pfVar2 = pstd::span<const_float>::begin(this_00);
  pstd::span<const_float>::end(this_00);
  args_2 = (char (*) [15])local_38;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff00,(polymorphic_allocator<std::byte> *)in_stack_fffffffffffffef8
            );
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(float *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  args_4 = args_3 + 1;
  args_5 = pstd::span<const_float>::begin(&local_20);
  fmt = pstd::span<const_float>::end(&local_20);
  args = (char (*) [15])local_50;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff00,(polymorphic_allocator<std::byte> *)in_stack_fffffffffffffef8
            );
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(float *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  pacVar3 = (char (*) [15])
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
  args_1 = pacVar3;
  pacVar4 = (char (*) [15])
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI + 1);
  if (pacVar3 != pacVar4) {
    LogFatal<char_const(&)[15],char_const(&)[14],char_const(&)[15],unsigned_long&,char_const(&)[14],unsigned_long&>
              ((LogLevel)((ulong)pfVar2 >> 0x20),(char *)this_00,(int)((ulong)in_RDI >> 0x20),
               (char *)fmt,args,(char (*) [14])args_1,args_2,(unsigned_long *)args_3,
               (char (*) [14])args_4,(unsigned_long *)args_5);
  }
  local_68 = 0;
  while( true ) {
    sVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
    if (sVar5 - 1 <= local_68) {
      return;
    }
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI,local_68);
    fVar1 = *pvVar6;
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI,local_68 + 1);
    if (*pvVar6 <= fVar1) break;
    local_68 = local_68 + 1;
  }
  LogFatal<char_const(&)[11],char_const(&)[15],char_const(&)[11],float&,char_const(&)[15],float&>
            ((LogLevel)((ulong)pfVar2 >> 0x20),(char *)this_00,(int)((ulong)in_RDI >> 0x20),
             (char *)fmt,(char (*) [11])args,args_1,(char (*) [11])args_2,(float *)args_3,
             (char (*) [15])args_4,args_5);
}

Assistant:

PiecewiseLinearSpectrum::PiecewiseLinearSpectrum(pstd::span<const Float> l,
                                                 pstd::span<const Float> v,
                                                 Allocator alloc)
    : lambdas(l.begin(), l.end(), alloc), values(v.begin(), v.end(), alloc) {
    CHECK_EQ(lambdas.size(), values.size());
    for (size_t i = 0; i < lambdas.size() - 1; ++i)
        CHECK_LT(lambdas[i], lambdas[i + 1]);
}